

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpx_helper.c
# Opt level: O2

uint64_t lookup_bte64(CPUX86State *env,uint64_t base,uintptr_t ra)

{
  uint64_t uVar1;
  ulong ptr;
  
  ptr = (env->bnd_regs[(ulong)((~env->hflags & 3) != 0) + 4].lb >> 8 & 0xfffffffffffff000) +
        (ulong)((uint)(base >> 0x11) & 0x7ffffff8);
  uVar1 = cpu_ldq_data_ra_x86_64(env,ptr,ra);
  if ((uVar1 & 1) != 0) {
    return (uVar1 & 0xfffffffffffffff8) + (ulong)((uint)base & 0xffff8) * 4;
  }
  (env->bndcs_regs).sts = ptr | 2;
  raise_exception_ra_x86_64(env,5,ra);
}

Assistant:

static uint64_t lookup_bte64(CPUX86State *env, uint64_t base, uintptr_t ra)
{
    uint64_t bndcsr, bde, bt;

    if ((env->hflags & HF_CPL_MASK) == 3) {
        bndcsr = env->bndcs_regs.cfgu;
    } else {
        bndcsr = env->msr_bndcfgs;
    }

    bde = (extract64(base, 20, 28) << 3) + (extract64(bndcsr, 20, 44) << 12);
    bt = cpu_ldq_data_ra(env, bde, ra);
    if ((bt & 1) == 0) {
        env->bndcs_regs.sts = bde | 2;
        raise_exception_ra(env, EXCP05_BOUND, ra);
    }

    return (extract64(base, 3, 17) << 5) + (bt & ~7);
}